

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Immediate.c
# Opt level: O0

void TestSuite_Immediate(void)

{
  bool bVar1;
  _Bool _Var2;
  sysbvm_char8_t sVar3;
  uint8_t uVar4;
  int8_t iVar5;
  sysbvm_char16_t sVar6;
  uint16_t uVar7;
  int16_t iVar8;
  sysbvm_char32_t sVar9;
  uint32_t uVar10;
  int32_t iVar11;
  sysbvm_tuple_t sVar12;
  uint64_t uVar13;
  int64_t iVar14;
  char *pcVar15;
  int Int64_isRunning;
  int UInt64_isRunning;
  int Int32_isRunning;
  int UInt32_isRunning;
  int Char32_isRunning;
  int Int16_isRunning;
  int UInt16_isRunning;
  int Char16_isRunning;
  int Int8_isRunning;
  int UInt8_isRunning;
  int Char8_isRunning;
  
  sysbvm_test_currentTestCaseName = "Char8";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Char8...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_char8_encode('\0');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:8: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char8_encode(0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode('\0');
    if ((sVar12 & 0xf) != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:9: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode('\x01');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:11: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char8_encode(1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode('\x01');
    if ((sVar12 & 0xf) != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:12: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode('\x02');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:14: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char8_encode(2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode('\x02');
    if ((sVar12 & 0xf) != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:15: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode(0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:17: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char8_encode(255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode(0xff);
    if ((sVar12 & 0xf) != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:18: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode('\0');
    sVar3 = sysbvm_tuple_char8_decode(sVar12);
    if (sVar3 != '\0') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:20: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode('\x01');
    sVar3 = sysbvm_tuple_char8_decode(sVar12);
    if (sVar3 != '\x01') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:21: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode('\x02');
    sVar3 = sysbvm_tuple_char8_decode(sVar12);
    if (sVar3 != '\x02') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:22: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char8_encode(0xff);
    sVar3 = sysbvm_tuple_char8_decode(sVar12);
    if (sVar3 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:23: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "UInt8";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- UInt8...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_uint8_encode('\0');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:28: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint8_encode(0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode('\0');
    if ((sVar12 & 0xf) != 3) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:29: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode('\x01');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:31: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint8_encode(1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode('\x01');
    if ((sVar12 & 0xf) != 3) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:32: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode('\x02');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:34: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint8_encode(2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode('\x02');
    if ((sVar12 & 0xf) != 3) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:35: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode(0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:37: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint8_encode(255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode(0xff);
    if ((sVar12 & 0xf) != 3) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:38: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode('\0');
    uVar4 = sysbvm_tuple_uint8_decode(sVar12);
    if (uVar4 != '\0') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:40: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode('\x01');
    uVar4 = sysbvm_tuple_uint8_decode(sVar12);
    if (uVar4 != '\x01') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:41: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode('\x02');
    uVar4 = sysbvm_tuple_uint8_decode(sVar12);
    if (uVar4 != '\x02') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:42: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint8_encode(0xff);
    uVar4 = sysbvm_tuple_uint8_decode(sVar12);
    if (uVar4 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:43: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "Int8";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Int8...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_int8_encode('\0');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:48: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode('\0');
    if ((sVar12 & 0xf) != 4) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:49: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode('\x01');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:51: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode('\x01');
    if ((sVar12 & 0xf) != 4) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:52: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode('\x02');
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:54: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode('\x02');
    if ((sVar12 & 0xf) != 4) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:55: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode(-1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:57: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(-1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode(-1);
    if ((sVar12 & 0xf) != 4) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:58: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode(-2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:60: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(-2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode(-2);
    if ((sVar12 & 0xf) != 4) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:61: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT8\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode('\0');
    iVar5 = sysbvm_tuple_int8_decode(sVar12);
    if (iVar5 != '\0') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:63: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode('\x01');
    iVar5 = sysbvm_tuple_int8_decode(sVar12);
    if (iVar5 != '\x01') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:64: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode('\x02');
    iVar5 = sysbvm_tuple_int8_decode(sVar12);
    if (iVar5 != '\x02') {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:65: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode(-1);
    iVar5 = sysbvm_tuple_int8_decode(sVar12);
    if (iVar5 != -1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:66: Obtained value is not equal to -1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int8_encode(-2);
    iVar5 = sysbvm_tuple_int8_decode(sVar12);
    if (iVar5 != -2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:67: Obtained value is not equal to -2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "Char16";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Char16...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_char16_encode(0);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:72: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(0);
    if ((sVar12 & 0xf) != 5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:73: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:75: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(1);
    if ((sVar12 & 0xf) != 5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:76: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:78: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(2);
    if ((sVar12 & 0xf) != 5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:79: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:81: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(0xff);
    if ((sVar12 & 0xf) != 5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:82: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:84: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(0xffff);
    if ((sVar12 & 0xf) != 5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:85: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(0);
    sVar6 = sysbvm_tuple_char16_decode(sVar12);
    if (sVar6 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:87: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(1);
    sVar6 = sysbvm_tuple_char16_decode(sVar12);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:88: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(2);
    sVar6 = sysbvm_tuple_char16_decode(sVar12);
    if (sVar6 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:89: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(0xff);
    sVar6 = sysbvm_tuple_char16_decode(sVar12);
    if (sVar6 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:90: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char16_encode(0xffff);
    sVar6 = sysbvm_tuple_char16_decode(sVar12);
    if (sVar6 != 0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:91: Obtained value is not equal to 65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "UInt16";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- UInt16...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_uint16_encode(0);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:96: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(0);
    if ((sVar12 & 0xf) != 6) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:97: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:99: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(1);
    if ((sVar12 & 0xf) != 6) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:100: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:102: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(2);
    if ((sVar12 & 0xf) != 6) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:103: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:105: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(0xff);
    if ((sVar12 & 0xf) != 6) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:106: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:108: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(0xffff);
    if ((sVar12 & 0xf) != 6) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:109: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(0);
    uVar7 = sysbvm_tuple_uint16_decode(sVar12);
    if (uVar7 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:111: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(1);
    uVar7 = sysbvm_tuple_uint16_decode(sVar12);
    if (uVar7 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:112: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(2);
    uVar7 = sysbvm_tuple_uint16_decode(sVar12);
    if (uVar7 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:113: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(0xff);
    uVar7 = sysbvm_tuple_uint16_decode(sVar12);
    if (uVar7 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:114: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint16_encode(0xffff);
    uVar7 = sysbvm_tuple_uint16_decode(sVar12);
    if (uVar7 != 0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:115: Obtained value is not equal to 65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "Int16";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Int16...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_int16_encode(0);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:120: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(0);
    if ((sVar12 & 0xf) != 7) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:121: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:123: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(1);
    if ((sVar12 & 0xf) != 7) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:124: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:126: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(2);
    if ((sVar12 & 0xf) != 7) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:127: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(-1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:129: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(-1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(-1);
    if ((sVar12 & 0xf) != 7) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:130: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(-2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:132: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(-2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(-2);
    if ((sVar12 & 0xf) != 7) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:133: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT16\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(0);
    iVar8 = sysbvm_tuple_int16_decode(sVar12);
    if (iVar8 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:135: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(1);
    iVar8 = sysbvm_tuple_int16_decode(sVar12);
    if (iVar8 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:136: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(2);
    iVar8 = sysbvm_tuple_int16_decode(sVar12);
    if (iVar8 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:137: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(0xff);
    iVar8 = sysbvm_tuple_int16_decode(sVar12);
    if (iVar8 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:138: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(-1);
    iVar8 = sysbvm_tuple_int16_decode(sVar12);
    if (iVar8 != -1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:139: Obtained value is not equal to -1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int16_encode(-2);
    iVar8 = sysbvm_tuple_int16_decode(sVar12);
    if (iVar8 != -2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:140: Obtained value is not equal to -2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "Char32";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Char32...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:145: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0);
    if ((sVar12 & 0xf) != 8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:146: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:148: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,1);
    if ((sVar12 & 0xf) != 8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:149: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:151: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,2);
    if ((sVar12 & 0xf) != 8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:152: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:154: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xff);
    if ((sVar12 & 0xf) != 8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:155: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:157: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xffff);
    if ((sVar12 & 0xf) != 8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:158: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xffffffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:160: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 4294967295))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xffffffff);
    if ((sVar12 & 0xf) != 8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:161: Obtained value is not equal to SYSBVM_TUPLE_TAG_CHAR32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0);
    sVar9 = sysbvm_tuple_char32_decode(sVar12);
    if (sVar9 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:163: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,1);
    sVar9 = sysbvm_tuple_char32_decode(sVar12);
    if (sVar9 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:164: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,2);
    sVar9 = sysbvm_tuple_char32_decode(sVar12);
    if (sVar9 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:165: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xff);
    sVar9 = sysbvm_tuple_char32_decode(sVar12);
    if (sVar9 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:166: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xffff);
    sVar9 = sysbvm_tuple_char32_decode(sVar12);
    if (sVar9 != 0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:167: Obtained value is not equal to 65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_char32_encode(sysbvm_test_context,0xffffffff);
    sVar9 = sysbvm_tuple_char32_decode(sVar12);
    if (sVar9 != 0xffffffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:168: Obtained value is not equal to 4294967295\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "UInt32";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- UInt32...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:173: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0);
    if ((sVar12 & 0xf) != 9) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:174: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:176: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,1);
    if ((sVar12 & 0xf) != 9) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:177: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:179: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,2);
    if ((sVar12 & 0xf) != 9) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:180: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:182: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xff);
    if ((sVar12 & 0xf) != 9) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:183: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:185: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xffff);
    if ((sVar12 & 0xf) != 9) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:186: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xffffffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:188: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 4294967295))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xffffffff);
    if ((sVar12 & 0xf) != 9) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:189: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0);
    uVar10 = sysbvm_tuple_uint32_decode(sVar12);
    if (uVar10 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:191: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,1);
    uVar10 = sysbvm_tuple_uint32_decode(sVar12);
    if (uVar10 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:192: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,2);
    uVar10 = sysbvm_tuple_uint32_decode(sVar12);
    if (uVar10 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:193: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xff);
    uVar10 = sysbvm_tuple_uint32_decode(sVar12);
    if (uVar10 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:194: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xffff);
    uVar10 = sysbvm_tuple_uint32_decode(sVar12);
    if (uVar10 != 0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:195: Obtained value is not equal to 65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint32_encode(sysbvm_test_context,0xffffffff);
    uVar10 = sysbvm_tuple_uint32_decode(sVar12);
    if (uVar10 != 0xffffffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:196: Obtained value is not equal to 4294967295\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "Int32";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Int32...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:201: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0);
    if ((sVar12 & 0xf) != 10) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:202: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:204: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,1);
    if ((sVar12 & 0xf) != 10) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:205: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:207: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,2);
    if ((sVar12 & 0xf) != 10) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:208: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:210: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0xff);
    if ((sVar12 & 0xf) != 10) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:211: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:213: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0xffff);
    if ((sVar12 & 0xf) != 10) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:214: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,-1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:216: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, -1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,-1);
    if ((sVar12 & 0xf) != 10) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:217: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,-0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:219: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, -65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,-0xffff);
    if ((sVar12 & 0xf) != 10) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:220: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT32\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:222: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,1);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:223: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,2);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:224: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0xff);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:225: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,0xffff);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != 0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:226: Obtained value is not equal to 65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,-1);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != -1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:227: Obtained value is not equal to -1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,-2);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != -2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:228: Obtained value is not equal to -2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,-0xff);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != -0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:229: Obtained value is not equal to -255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int32_encode(sysbvm_test_context,-0xffff);
    iVar11 = sysbvm_tuple_int32_decode(sVar12);
    if (iVar11 != -0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:230: Obtained value is not equal to -65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "UInt64";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- UInt64...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:235: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0);
    if ((sVar12 & 0xf) != 0xb) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:236: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:238: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,1);
    if ((sVar12 & 0xf) != 0xb) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:239: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:241: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,2);
    if ((sVar12 & 0xf) != 0xb) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:242: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:244: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xff);
    if ((sVar12 & 0xf) != 0xb) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:245: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:247: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xffff);
    if ((sVar12 & 0xf) != 0xb) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:248: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xffffffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:250: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 4294967295))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xffffffff);
    if ((sVar12 & 0xf) != 0xb) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:251: Obtained value is not equal to SYSBVM_TUPLE_TAG_UINT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0);
    uVar13 = sysbvm_tuple_uint64_decode(sVar12);
    if (uVar13 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:253: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,1);
    uVar13 = sysbvm_tuple_uint64_decode(sVar12);
    if (uVar13 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:254: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,2);
    uVar13 = sysbvm_tuple_uint64_decode(sVar12);
    if (uVar13 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:255: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xff);
    uVar13 = sysbvm_tuple_uint64_decode(sVar12);
    if (uVar13 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:256: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xffff);
    uVar13 = sysbvm_tuple_uint64_decode(sVar12);
    if (uVar13 != 0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:257: Obtained value is not equal to 65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_uint64_encode(sysbvm_test_context,0xffffffff);
    uVar13 = sysbvm_tuple_uint64_decode(sVar12);
    if (uVar13 != 0xffffffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:258: Obtained value is not equal to 4294967295\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  sysbvm_test_currentTestCaseName = "Int64";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Int64...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:263: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 0))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0);
    if ((sVar12 & 0xf) != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:264: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:266: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,1);
    if ((sVar12 & 0xf) != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:267: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,2);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:269: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 2))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,2);
    if ((sVar12 & 0xf) != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:270: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0xff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:272: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 255))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0xff);
    if ((sVar12 & 0xf) != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:273: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:275: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0xffff);
    if ((sVar12 & 0xf) != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:276: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-1);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:278: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, -1))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-1);
    if ((sVar12 & 0xf) != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:279: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-0xffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:281: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, -65535))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-0xffff);
    if ((sVar12 & 0xf) != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:282: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-0xffffffff);
    _Var2 = sysbvm_tuple_isImmediate(sVar12);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:284: Assertion failure: sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, -4294967295ll))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-0xffffffff);
    if ((sVar12 & 0xf) != 0xc) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:285: Obtained value is not equal to SYSBVM_TUPLE_TAG_INT64\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:287: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,1);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:288: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,2);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != 2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:289: Obtained value is not equal to 2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0xff);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != 0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:290: Obtained value is not equal to 255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0xffff);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != 0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:291: Obtained value is not equal to 65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,0xffffffff);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != 0xffffffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:292: Obtained value is not equal to 4294967295\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-1);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != -1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:293: Obtained value is not equal to -1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-2);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != -2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:294: Obtained value is not equal to -2\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-0xff);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != -0xff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:295: Obtained value is not equal to -255\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-0xffff);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != -0xffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:296: Obtained value is not equal to -65535\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar12 = sysbvm_tuple_int64_encode(sysbvm_test_context,-0xffffffff);
    iVar14 = sysbvm_tuple_int64_decode(sVar12);
    if (iVar14 != -0xffffffff) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Immediate.c:297: Obtained value is not equal to -4294967295ll\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar15 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar15 = "";
    }
    printf(pcVar15);
  }
  return;
}

Assistant:

TEST_SUITE(Immediate)
{
    TEST_CASE_WITH_FIXTURE(Char8, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char8_encode(0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR8, sysbvm_tuple_char8_encode(0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char8_encode(1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR8, sysbvm_tuple_char8_encode(1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char8_encode(2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR8, sysbvm_tuple_char8_encode(2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char8_encode(255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR8, sysbvm_tuple_char8_encode(255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_char8_decode(sysbvm_tuple_char8_encode(0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_char8_decode(sysbvm_tuple_char8_encode(1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_char8_decode(sysbvm_tuple_char8_encode(2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_char8_decode(sysbvm_tuple_char8_encode(255)));
    }

    TEST_CASE_WITH_FIXTURE(UInt8, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint8_encode(0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT8, sysbvm_tuple_uint8_encode(0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint8_encode(1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT8, sysbvm_tuple_uint8_encode(1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint8_encode(2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT8, sysbvm_tuple_uint8_encode(2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint8_encode(255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT8, sysbvm_tuple_uint8_encode(255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_uint8_decode(sysbvm_tuple_uint8_encode(0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_uint8_decode(sysbvm_tuple_uint8_encode(1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_uint8_decode(sysbvm_tuple_uint8_encode(2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_uint8_decode(sysbvm_tuple_uint8_encode(255)));
    }

    TEST_CASE_WITH_FIXTURE(Int8, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT8, sysbvm_tuple_int8_encode(0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT8, sysbvm_tuple_int8_encode(1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT8, sysbvm_tuple_int8_encode(2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(-1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT8, sysbvm_tuple_int8_encode(-1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int8_encode(-2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT8, sysbvm_tuple_int8_encode(-2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_int8_decode(sysbvm_tuple_int8_encode(0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_int8_decode(sysbvm_tuple_int8_encode(1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_int8_decode(sysbvm_tuple_int8_encode(2)));
        TEST_ASSERT_EQUALS(-1, sysbvm_tuple_int8_decode(sysbvm_tuple_int8_encode(-1)));
        TEST_ASSERT_EQUALS(-2, sysbvm_tuple_int8_decode(sysbvm_tuple_int8_encode(-2)));
    }

    TEST_CASE_WITH_FIXTURE(Char16, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR16, sysbvm_tuple_char16_encode(0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR16, sysbvm_tuple_char16_encode(1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR16, sysbvm_tuple_char16_encode(2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR16, sysbvm_tuple_char16_encode(255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char16_encode(65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR16, sysbvm_tuple_char16_encode(65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_char16_decode(sysbvm_tuple_char16_encode(0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_char16_decode(sysbvm_tuple_char16_encode(1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_char16_decode(sysbvm_tuple_char16_encode(2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_char16_decode(sysbvm_tuple_char16_encode(255)));
        TEST_ASSERT_EQUALS(65535, sysbvm_tuple_char16_decode(sysbvm_tuple_char16_encode(65535)));
    }

    TEST_CASE_WITH_FIXTURE(UInt16, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT16, sysbvm_tuple_uint16_encode(0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT16, sysbvm_tuple_uint16_encode(1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT16, sysbvm_tuple_uint16_encode(2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT16, sysbvm_tuple_uint16_encode(255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint16_encode(65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT16, sysbvm_tuple_uint16_encode(65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_uint16_decode(sysbvm_tuple_uint16_encode(0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_uint16_decode(sysbvm_tuple_uint16_encode(1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_uint16_decode(sysbvm_tuple_uint16_encode(2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_uint16_decode(sysbvm_tuple_uint16_encode(255)));
        TEST_ASSERT_EQUALS(65535, sysbvm_tuple_uint16_decode(sysbvm_tuple_uint16_encode(65535)));
    }

    TEST_CASE_WITH_FIXTURE(Int16, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT16, sysbvm_tuple_int16_encode(0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT16, sysbvm_tuple_int16_encode(1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT16, sysbvm_tuple_int16_encode(2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(-1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT16, sysbvm_tuple_int16_encode(-1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int16_encode(-2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT16, sysbvm_tuple_int16_encode(-2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_int16_decode(sysbvm_tuple_int16_encode(0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_int16_decode(sysbvm_tuple_int16_encode(1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_int16_decode(sysbvm_tuple_int16_encode(2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_int16_decode(sysbvm_tuple_int16_encode(255)));
        TEST_ASSERT_EQUALS(-1, sysbvm_tuple_int16_decode(sysbvm_tuple_int16_encode(-1)));
        TEST_ASSERT_EQUALS(-2, sysbvm_tuple_int16_decode(sysbvm_tuple_int16_encode(-2)));
    }

    TEST_CASE_WITH_FIXTURE(Char32, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR32, sysbvm_tuple_char32_encode(sysbvm_test_context, 0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR32, sysbvm_tuple_char32_encode(sysbvm_test_context, 1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR32, sysbvm_tuple_char32_encode(sysbvm_test_context, 2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR32, sysbvm_tuple_char32_encode(sysbvm_test_context, 255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR32, sysbvm_tuple_char32_encode(sysbvm_test_context, 65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_char32_encode(sysbvm_test_context, 4294967295)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_CHAR32, sysbvm_tuple_char32_encode(sysbvm_test_context, 4294967295) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_char32_decode(sysbvm_tuple_char32_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_char32_decode(sysbvm_tuple_char32_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_char32_decode(sysbvm_tuple_char32_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_char32_decode(sysbvm_tuple_char32_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(65535, sysbvm_tuple_char32_decode(sysbvm_tuple_char32_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(4294967295, sysbvm_tuple_char32_decode(sysbvm_tuple_char32_encode(sysbvm_test_context, 4294967295)));
    }

    TEST_CASE_WITH_FIXTURE(UInt32, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT32, sysbvm_tuple_uint32_encode(sysbvm_test_context, 0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT32, sysbvm_tuple_uint32_encode(sysbvm_test_context, 1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT32, sysbvm_tuple_uint32_encode(sysbvm_test_context, 2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT32, sysbvm_tuple_uint32_encode(sysbvm_test_context, 255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT32, sysbvm_tuple_uint32_encode(sysbvm_test_context, 65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint32_encode(sysbvm_test_context, 4294967295)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT32, sysbvm_tuple_uint32_encode(sysbvm_test_context, 4294967295) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_uint32_decode(sysbvm_tuple_uint32_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_uint32_decode(sysbvm_tuple_uint32_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_uint32_decode(sysbvm_tuple_uint32_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_uint32_decode(sysbvm_tuple_uint32_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(65535, sysbvm_tuple_uint32_decode(sysbvm_tuple_uint32_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(4294967295, sysbvm_tuple_uint32_decode(sysbvm_tuple_uint32_encode(sysbvm_test_context, 4294967295)));
    }

    TEST_CASE_WITH_FIXTURE(Int32, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT32, sysbvm_tuple_int32_encode(sysbvm_test_context, 0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT32, sysbvm_tuple_int32_encode(sysbvm_test_context, 1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT32, sysbvm_tuple_int32_encode(sysbvm_test_context, 2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT32, sysbvm_tuple_int32_encode(sysbvm_test_context, 255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT32, sysbvm_tuple_int32_encode(sysbvm_test_context, 65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, -1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT32, sysbvm_tuple_int32_encode(sysbvm_test_context, -1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int32_encode(sysbvm_test_context, -65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT32, sysbvm_tuple_int32_encode(sysbvm_test_context, -65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(65535, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(-1, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, -1)));
        TEST_ASSERT_EQUALS(-2, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, -2)));
        TEST_ASSERT_EQUALS(-255, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, -255)));
        TEST_ASSERT_EQUALS(-65535, sysbvm_tuple_int32_decode(sysbvm_tuple_int32_encode(sysbvm_test_context, -65535)));
    }

    TEST_CASE_WITH_FIXTURE(UInt64, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT64, sysbvm_tuple_uint64_encode(sysbvm_test_context, 0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT64, sysbvm_tuple_uint64_encode(sysbvm_test_context, 1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT64, sysbvm_tuple_uint64_encode(sysbvm_test_context, 2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT64, sysbvm_tuple_uint64_encode(sysbvm_test_context, 255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT64, sysbvm_tuple_uint64_encode(sysbvm_test_context, 65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_uint64_encode(sysbvm_test_context, 4294967295)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_UINT64, sysbvm_tuple_uint64_encode(sysbvm_test_context, 4294967295) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_uint64_decode(sysbvm_tuple_uint64_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_uint64_decode(sysbvm_tuple_uint64_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_uint64_decode(sysbvm_tuple_uint64_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_uint64_decode(sysbvm_tuple_uint64_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(65535, sysbvm_tuple_uint64_decode(sysbvm_tuple_uint64_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(4294967295, sysbvm_tuple_uint64_decode(sysbvm_tuple_uint64_encode(sysbvm_test_context, 4294967295)));
    }

    TEST_CASE_WITH_FIXTURE(Int64, TuuvmCore)
    {
        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT64, sysbvm_tuple_int64_encode(sysbvm_test_context, 0) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT64, sysbvm_tuple_int64_encode(sysbvm_test_context, 1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT64, sysbvm_tuple_int64_encode(sysbvm_test_context, 2) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT64, sysbvm_tuple_int64_encode(sysbvm_test_context, 255) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT64, sysbvm_tuple_int64_encode(sysbvm_test_context, 65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, -1)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT64, sysbvm_tuple_int64_encode(sysbvm_test_context, -1) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, -65535)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT64, sysbvm_tuple_int64_encode(sysbvm_test_context, -65535) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT(sysbvm_tuple_isImmediate(sysbvm_tuple_int64_encode(sysbvm_test_context, -4294967295ll)));
        TEST_ASSERT_EQUALS(SYSBVM_TUPLE_TAG_INT64, sysbvm_tuple_int64_encode(sysbvm_test_context, -4294967295ll) & SYSBVM_TUPLE_TAG_BIT_MASK);

        TEST_ASSERT_EQUALS(0, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, 0)));
        TEST_ASSERT_EQUALS(1, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, 1)));
        TEST_ASSERT_EQUALS(2, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, 2)));
        TEST_ASSERT_EQUALS(255, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, 255)));
        TEST_ASSERT_EQUALS(65535, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, 65535)));
        TEST_ASSERT_EQUALS(4294967295, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, 4294967295)));
        TEST_ASSERT_EQUALS(-1, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, -1)));
        TEST_ASSERT_EQUALS(-2, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, -2)));
        TEST_ASSERT_EQUALS(-255, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, -255)));
        TEST_ASSERT_EQUALS(-65535, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, -65535)));
        TEST_ASSERT_EQUALS(-4294967295ll, sysbvm_tuple_int64_decode(sysbvm_tuple_int64_encode(sysbvm_test_context, -4294967295ll)));
    }
}